

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_refs_ptrs_up(mtbdd_refs_internal_t mtbdd_refs_key)

{
  MTBDD **ppMVar1;
  MTBDD **ppMVar2;
  long lVar3;
  MTBDD **ppMVar4;
  size_t size;
  size_t cur;
  mtbdd_refs_internal_t mtbdd_refs_key_local;
  
  ppMVar1 = mtbdd_refs_key->pcur;
  ppMVar2 = mtbdd_refs_key->pbegin;
  lVar3 = (long)mtbdd_refs_key->pend - (long)mtbdd_refs_key->pbegin >> 3;
  ppMVar4 = (MTBDD **)realloc(mtbdd_refs_key->pbegin,lVar3 << 4);
  mtbdd_refs_key->pbegin = ppMVar4;
  mtbdd_refs_key->pcur = mtbdd_refs_key->pbegin + ((long)ppMVar1 - (long)ppMVar2 >> 3);
  mtbdd_refs_key->pend = mtbdd_refs_key->pbegin + lVar3 * 2;
  return;
}

Assistant:

void
mtbdd_refs_ptrs_up(mtbdd_refs_internal_t mtbdd_refs_key)
{
    size_t cur = mtbdd_refs_key->pcur - mtbdd_refs_key->pbegin;
    size_t size = mtbdd_refs_key->pend - mtbdd_refs_key->pbegin;
    mtbdd_refs_key->pbegin = (const MTBDD**)realloc(mtbdd_refs_key->pbegin, sizeof(MTBDD*) * size * 2);
    mtbdd_refs_key->pcur = mtbdd_refs_key->pbegin + cur;
    mtbdd_refs_key->pend = mtbdd_refs_key->pbegin + (size * 2);
}